

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_solver3_propagate(sat_solver3 *s)

{
  lit l;
  bool bVar1;
  int iVar2;
  lit lVar3;
  int iVar4;
  uint uVar5;
  veci *v;
  lit *plVar6;
  clause *c_00;
  veci *v_00;
  int *piVar7;
  int *piVar8;
  lit *local_70;
  lit *k;
  lit *stop;
  clause *c;
  int *piStack_50;
  int Lit;
  int *j;
  int *i;
  int *end;
  int *begin;
  veci *ws;
  lit p;
  lit false_lit;
  lit *lits;
  int hConfl;
  sat_solver3 *s_local;
  
  lits._4_4_ = 0;
  do {
    bVar1 = false;
    if (lits._4_4_ == 0) {
      bVar1 = 0 < s->qtail - s->qhead;
    }
    if (!bVar1) {
      return lits._4_4_;
    }
    iVar2 = s->qhead;
    s->qhead = iVar2 + 1;
    l = s->trail[iVar2];
    v = sat_solver3_read_wlist(s,l);
    piStack_50 = veci_begin(v);
    iVar2 = veci_size(v);
    piVar7 = piStack_50 + iVar2;
    (s->stats).propagations = (s->stats).propagations + 1;
    j = piStack_50;
    while (j < piVar7) {
      iVar2 = clause_is_lit(*j);
      if (iVar2 == 0) {
        c_00 = clause_read(s,*j);
        plVar6 = clause_begin(c_00);
        lVar3 = lit_neg(l);
        if (*plVar6 == lVar3) {
          *plVar6 = plVar6[1];
          plVar6[1] = lVar3;
        }
        if (plVar6[1] != lVar3) {
          __assert_fail("lits[1] == false_lit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                        ,0x427,"int sat_solver3_propagate(sat_solver3 *)");
        }
        iVar2 = lit_var(*plVar6);
        iVar2 = var_value(s,iVar2);
        iVar4 = lit_sign(*plVar6);
        if (iVar2 == iVar4) {
          *piStack_50 = *j;
          piStack_50 = piStack_50 + 1;
        }
        else {
          iVar2 = clause_size(c_00);
          for (local_70 = plVar6 + 2; local_70 < plVar6 + iVar2; local_70 = local_70 + 1) {
            iVar4 = lit_var(*local_70);
            uVar5 = var_value(s,iVar4);
            iVar4 = lit_sign(*local_70);
            if (uVar5 != ((iVar4 != 0 ^ 0xffU) & 1)) {
              plVar6[1] = *local_70;
              *local_70 = lVar3;
              lVar3 = lit_neg(plVar6[1]);
              v_00 = sat_solver3_read_wlist(s,lVar3);
              veci_push(v_00,*j);
              goto LAB_00bb5071;
            }
          }
          piVar8 = piStack_50 + 1;
          *piStack_50 = *j;
          if (((uint)*c_00 & 1) != 0) {
            uVar5 = sat_clause_compute_lbd(s,c_00);
            *c_00 = (clause)((uint)*c_00 & 0xfffff807 | (uVar5 & 0xff) << 3);
          }
          iVar2 = sat_solver3_enqueue(s,*plVar6,*j);
          piStack_50 = piVar8;
          if (iVar2 == 0) {
            lits._4_4_ = *j;
            while (j = j + 1, j < piVar7) {
              *piStack_50 = *j;
              piStack_50 = piStack_50 + 1;
            }
          }
        }
LAB_00bb5071:
        j = j + 1;
      }
      else {
        lVar3 = clause_read_lit(*j);
        iVar2 = lit_var(lVar3);
        iVar2 = var_value(s,iVar2);
        iVar4 = lit_sign(lVar3);
        if (iVar2 != iVar4) {
          piVar8 = piStack_50 + 1;
          *piStack_50 = *j;
          lVar3 = clause_read_lit(*j);
          iVar2 = clause_from_lit(l);
          iVar2 = sat_solver3_enqueue(s,lVar3,iVar2);
          piStack_50 = piVar8;
          if (iVar2 == 0) {
            lits._4_4_ = s->hBinary;
            lVar3 = lit_neg(l);
            plVar6 = clause_begin(s->binary);
            plVar6[1] = lVar3;
            lVar3 = clause_read_lit(*j);
            plVar6 = clause_begin(s->binary);
            *plVar6 = lVar3;
            while (j = j + 1, j < piVar7) {
              *piStack_50 = *j;
              piStack_50 = piStack_50 + 1;
            }
          }
          goto LAB_00bb5071;
        }
        *piStack_50 = *j;
        piStack_50 = piStack_50 + 1;
        j = j + 1;
      }
    }
    piVar7 = veci_begin(v);
    (s->stats).inspects = ((long)piStack_50 - (long)piVar7 >> 2) + (s->stats).inspects;
    piVar7 = veci_begin(v);
    veci_resize(v,(int)((long)piStack_50 - (long)piVar7 >> 2));
  } while( true );
}

Assistant:

int sat_solver3_propagate(sat_solver3* s)
{
    int     hConfl = 0;
    lit*    lits;
    lit false_lit;

    //printf("sat_solver3_propagate\n");
    while (hConfl == 0 && s->qtail - s->qhead > 0){
        lit p = s->trail[s->qhead++];

#ifdef TEST_CNF_LOAD
        int v = lit_var(p);
        if ( s->pCnfFunc )
        {
            if ( lit_sign(p) )
            {
                if ( (s->loads[v] & 1) == 0 )
                {
                    s->loads[v] ^= 1;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
            else
            {
                if ( (s->loads[v] & 2) == 0 )
                {
                    s->loads[v] ^= 2;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
        }
        {
#endif

        veci* ws    = sat_solver3_read_wlist(s,p);
        int*  begin = veci_begin(ws);
        int*  end   = begin + veci_size(ws);
        int*i, *j;

        s->stats.propagations++;
//        s->simpdb_props--;

        //printf("checking lit %d: "L_LIT"\n", veci_size(ws), L_lit(p));
        for (i = j = begin; i < end; ){
            if (clause_is_lit(*i)){

                int Lit = clause_read_lit(*i);
                if (var_value(s, lit_var(Lit)) == lit_sign(Lit)){
                    *j++ = *i++;
                    continue;
                }

                *j++ = *i;
                if (!sat_solver3_enqueue(s,clause_read_lit(*i),clause_from_lit(p))){
                    hConfl = s->hBinary;
                    (clause_begin(s->binary))[1] = lit_neg(p);
                    (clause_begin(s->binary))[0] = clause_read_lit(*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }else{

                clause* c = clause_read(s,*i);
                lits = clause_begin(c);

                // Make sure the false literal is data[1]:
                false_lit = lit_neg(p);
                if (lits[0] == false_lit){
                    lits[0] = lits[1];
                    lits[1] = false_lit;
                }
                assert(lits[1] == false_lit);

                // If 0th watch is true, then clause is already satisfied.
                if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                    *j++ = *i;
                else{
                    // Look for new watch:
                    lit* stop = lits + clause_size(c);
                    lit* k;
                    for (k = lits + 2; k < stop; k++){
                        if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                            lits[1] = *k;
                            *k = false_lit;
                            veci_push(sat_solver3_read_wlist(s,lit_neg(lits[1])),*i);
                            goto next; }
                    }

                    *j++ = *i;
                    // Clause is unit under assignment:
                    if ( c->lrn )
                        c->lbd = sat_clause_compute_lbd(s, c);
                    if (!sat_solver3_enqueue(s,lits[0], *i)){
                        hConfl = *i++;
                        // Copy the remaining watches:
                        while (i < end)
                            *j++ = *i++;
                    }
                }
            }
        next:
            i++;
        }

        s->stats.inspects += j - veci_begin(ws);
        veci_resize(ws,j - veci_begin(ws));
#ifdef TEST_CNF_LOAD
        }
#endif
    }

    return hConfl;
}